

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O3

void do_stop_waiting_for_dialog_proc(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Object widget;
  Am_Value v;
  Am_Object AStack_38;
  Am_Object local_30;
  Am_Value local_28;
  Am_Value local_18;
  
  Am_Object::Get_Object(&AStack_38,(Am_Slot_Key)cmd,10);
  bVar1 = Am_Object::Valid(&AStack_38);
  if (bVar1) {
    local_28.type = 0;
    local_28.value.wrapper_value = (Am_Wrapper *)0x0;
    in_value = Am_Object::Get(&AStack_38,0x169,1);
    Am_Value::operator=(&local_28,in_value);
    Am_Object::Am_Object(&local_30,&AStack_38);
    Am_Value::Am_Value(&local_18,&local_28);
    Am_Finish_Pop_Up_Waiting(&local_30,&local_18);
    Am_Value::~Am_Value(&local_18);
    Am_Object::~Am_Object(&local_30);
    Am_Value::~Am_Value(&local_28);
  }
  Am_Object::~Am_Object(&AStack_38);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_stop_waiting_for_dialog,
                 (Am_Object cmd))
{
  Am_Object widget = cmd.Get_Owner();
  if (widget.Valid()) {
    // we want to stop the text input widget if it exists
    Am_Value v;
    v = widget.Peek(Am_VALUE);
    Am_Finish_Pop_Up_Waiting(widget, v);
  }
  // else do nothing, something's not valid.
}